

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userobject.cpp
# Opt level: O2

void __thiscall camp::UserObject::set(UserObject *this,Property *property,Value *value)

{
  ParentObject *pPVar1;
  NullObject *__return_storage_ptr__;
  ParentObject *this_00;
  scoped_ptr<camp::ParentObject> *this_01;
  allocator local_ba;
  allocator local_b9;
  string local_b8;
  string local_98;
  NullObject local_78;
  
  if ((this->m_holder).
      super___shared_ptr<camp::detail::AbstractObjectHolder,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    (*(property->super_TagHolder)._vptr_TagHolder[4])(property,this,value);
    return;
  }
  if ((this->m_parent).px != (ParentObject *)0x0) {
    do {
      this_00 = (ParentObject *)this;
      this_01 = &(this_00->object).m_parent;
      pPVar1 = boost::scoped_ptr<camp::ParentObject>::operator->(this_01);
      pPVar1 = (pPVar1->object).m_parent.px;
      this = &boost::scoped_ptr<camp::ParentObject>::operator->(this_01)->object;
    } while (pPVar1 != (ParentObject *)0x0);
    cascadeSet(&this_00->object,this,property,value);
    return;
  }
  __return_storage_ptr__ = (NullObject *)__cxa_allocate_exception(0x48);
  NullObject::NullObject(&local_78,this->m_class);
  std::__cxx11::string::string
            ((string *)&local_98,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/userobject.cpp"
             ,&local_b9);
  std::__cxx11::string::string
            ((string *)&local_b8,"void camp::UserObject::set(const Property &, const Value &) const"
             ,&local_ba);
  Error::prepare<camp::NullObject>(__return_storage_ptr__,&local_78,&local_98,0xd7,&local_b8);
  __cxa_throw(__return_storage_ptr__,&NullObject::typeinfo,Error::~Error);
}

Assistant:

void UserObject::set(const Property& property, const Value& value) const
{
    if (m_holder)
    {
        // Just forward to the property, no extra processing required
        property.setValue(*this, value);
    }
    else if (m_parent)
    {
        // Find the root object
        const UserObject* root = this;
        while (root->m_parent->object.m_parent)
            root = &root->m_parent->object;

        // Launch the recursive process
        root->cascadeSet(root->m_parent->object, property, value);
    }
    else
    {
        // Error, null object
        CAMP_ERROR(NullObject(m_class));
    }
}